

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

void HCP(uint8_t *sigH,uint16_t *challengeC,uint16_t *challengeP,commitments_t *Ch,uint8_t *hCv,
        uint8_t *salt,uint8_t *pubKey,uint8_t *plaintext,uint8_t *message,size_t messageByteLength,
        picnic_instance_t *params)

{
  uint capacity;
  uint rate;
  ulong uVar1;
  Keccak_HashInstance local_110;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  Keccak_HashInitialize(&local_110,rate,capacity,0,'\x1f');
  if (params->num_rounds != 0) {
    uVar1 = 0;
    do {
      Keccak_HashUpdate(&local_110,Ch->hashes[uVar1],(ulong)params->digest_size << 3);
      uVar1 = uVar1 + 1;
    } while (uVar1 < params->num_rounds);
  }
  Keccak_HashUpdate(&local_110,hCv,(ulong)params->digest_size << 3);
  Keccak_HashUpdate(&local_110,salt,0x100);
  Keccak_HashUpdate(&local_110,pubKey,(ulong)params->input_output_size << 3);
  Keccak_HashUpdate(&local_110,plaintext,(ulong)params->input_output_size << 3);
  Keccak_HashUpdate(&local_110,message,messageByteLength << 3);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,sigH,(ulong)params->digest_size << 3);
  expandChallenge(challengeC,challengeP,sigH,params);
  return;
}

Assistant:

static void HCP(uint8_t* sigH, uint16_t* challengeC, uint16_t* challengeP, const commitments_t* Ch,
                uint8_t* hCv, uint8_t* salt, const uint8_t* pubKey, const uint8_t* plaintext,
                const uint8_t* message, size_t messageByteLength, const picnic_instance_t* params) {
  hash_context ctx;

  assert(params->num_opened_rounds < params->num_rounds);

  hash_init(&ctx, params->digest_size);
  for (size_t t = 0; t < params->num_rounds; t++) {
    hash_update(&ctx, Ch->hashes[t], params->digest_size);
  }

  hash_update(&ctx, hCv, params->digest_size);
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update(&ctx, pubKey, params->input_output_size);
  hash_update(&ctx, plaintext, params->input_output_size);
  hash_update(&ctx, message, messageByteLength);
  hash_final(&ctx);
  hash_squeeze(&ctx, sigH, params->digest_size);
  hash_clear(&ctx);
  /* parts of this hash will be published as challenge so is public anyway */
  picnic_declassify(sigH, params->digest_size);

  expandChallenge(challengeC, challengeP, sigH, params);
}